

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_name_resolver.cc
# Opt level: O3

NameEquality
google::protobuf::compiler::java::anon_unknown_0::CheckNameEquality(string *a,string *b)

{
  size_t __n;
  undefined8 uVar1;
  int iVar2;
  pointer pcVar3;
  NameEquality NVar4;
  bool bVar5;
  size_type *local_78;
  string out;
  string out_1;
  
  pcVar3 = (a->_M_dataplus)._M_p;
  local_78 = &out._M_string_length;
  out_1.field_2._8_8_ = a;
  std::__cxx11::string::_M_construct<char*>((string *)&local_78,pcVar3,pcVar3 + a->_M_string_length)
  ;
  if (out._M_dataplus._M_p != (pointer)0x0) {
    pcVar3 = (pointer)0x0;
    do {
      if ((byte)(*(char *)((long)local_78 + (long)pcVar3) + 0x9fU) < 0x1a) {
        *(char *)((long)local_78 + (long)pcVar3) = *(char *)((long)local_78 + (long)pcVar3) + -0x20;
      }
      pcVar3 = pcVar3 + 1;
    } while (out._M_dataplus._M_p != pcVar3);
  }
  pcVar3 = (b->_M_dataplus)._M_p;
  out.field_2._8_8_ = &out_1._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&out.field_2 + 8),pcVar3,pcVar3 + b->_M_string_length);
  uVar1 = out.field_2._8_8_;
  if (out_1._M_dataplus._M_p == (pointer)0x0) {
    if (out._M_dataplus._M_p == (pointer)0x0) {
      bVar5 = true;
      goto LAB_0022a8e9;
    }
  }
  else {
    pcVar3 = (pointer)0x0;
    do {
      if ((byte)(pcVar3[out.field_2._8_8_] + 0x9fU) < 0x1a) {
        pcVar3[out.field_2._8_8_] = pcVar3[out.field_2._8_8_] + -0x20;
      }
      pcVar3 = pcVar3 + 1;
    } while (out_1._M_dataplus._M_p != pcVar3);
    if (out._M_dataplus._M_p == out_1._M_dataplus._M_p) {
      if (out_1._M_dataplus._M_p == (pointer)0x0) {
        bVar5 = true;
      }
      else {
        iVar2 = bcmp(local_78,(void *)out.field_2._8_8_,(size_t)out_1._M_dataplus._M_p);
        bVar5 = iVar2 == 0;
      }
      goto LAB_0022a8e9;
    }
  }
  bVar5 = false;
LAB_0022a8e9:
  if ((size_type *)uVar1 != &out_1._M_string_length) {
    operator_delete((void *)uVar1);
  }
  if (local_78 != &out._M_string_length) {
    operator_delete(local_78);
  }
  NVar4 = NO_MATCH;
  if (bVar5) {
    __n = *(size_t *)(out_1.field_2._8_8_ + 8);
    NVar4 = EQUAL_IGNORE_CASE;
    if (__n == b->_M_string_length) {
      if ((__n != 0) &&
         (iVar2 = bcmp(*(void **)out_1.field_2._8_8_,(b->_M_dataplus)._M_p,__n), iVar2 != 0)) {
        return EQUAL_IGNORE_CASE;
      }
      NVar4 = EXACT_EQUAL;
    }
  }
  return NVar4;
}

Assistant:

NameEquality CheckNameEquality(const string& a, const string& b) {
  if (ToUpper(a) == ToUpper(b)) {
    if (a == b) {
      return NameEquality::EXACT_EQUAL;
    }
    return NameEquality::EQUAL_IGNORE_CASE;
  }
  return NameEquality::NO_MATCH;
}